

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_simple_key<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  char_type_conflict cVar1;
  value_type *this;
  error_info *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  char *__s;
  string *this_00;
  error_info *peVar3;
  string postfix;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  str_res;
  allocator<char> local_351;
  repeat_at_least local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_2b8;
  error_info local_228;
  location local_1d0;
  string local_188 [32];
  undefined1 local_168 [64];
  error_info local_128;
  error_info local_d0;
  error_info local_78;
  
  cVar1 = location::current(loc);
  if (cVar1 == '\"') {
    parse_basic_string_only<toml::type_config>(&local_2b8,loc,ctx);
    if (local_2b8.is_ok_ == true) {
      this = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_2b8,(source_location)0x469ff8);
      peVar3 = (error_info *)(local_168 + 0x20);
      v = extraout_RDX;
LAB_002f0654:
      ok<std::__cxx11::string>
                ((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)peVar3,(toml *)this,v);
      peVar2 = peVar3;
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::result(__return_storage_ptr__,(success_type *)peVar3);
      std::__cxx11::string::~string((string *)peVar3);
      goto LAB_002f0787;
    }
    peVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap_err(&local_2b8,(source_location)0x46a010);
    peVar3 = &local_78;
  }
  else {
    cVar1 = location::current(loc);
    if (cVar1 != '\'') {
      syntax::unquoted_key((repeat_at_least *)&local_228,&ctx->toml_spec_);
      repeat_at_least::scan((region *)&local_2b8,(repeat_at_least *)&local_228,loc);
      if ((long *)local_228.title_.field_2._M_allocated_capacity != (long *)0x0) {
        (**(code **)(*(long *)local_228.title_.field_2._M_allocated_capacity + 8))();
      }
      if (CONCAT71(local_2b8._1_7_,local_2b8.is_ok_) == 0) {
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        local_338._M_string_length = 0;
        local_338.field_2._M_local_buf[0] = '\0';
        __s = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
        if ((ctx->toml_spec_).v1_1_0_allow_non_english_in_bare_keys != false) {
          __s = "Hint: Not all Unicode characters are allowed as bare key.\n";
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&local_338,__s);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,
                   "toml::parse_simple_key: invalid key: key must be \"quoted\", \'quoted-literal\', or bare key."
                   ,&local_351);
        syntax::unquoted_key(&local_350,&ctx->toml_spec_);
        location::location(&local_1d0,loc);
        std::__cxx11::string::string((string *)&local_318,&local_338);
        make_syntax_error<toml::detail::repeat_at_least>
                  (&local_228,&local_2f8,&local_350,&local_1d0,&local_318);
        err<toml::error_info>((failure<toml::error_info> *)&local_128,&local_228);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_128);
        error_info::~error_info(&local_128);
        error_info::~error_info(&local_228);
        std::__cxx11::string::~string((string *)&local_318);
        location::~location(&local_1d0);
        if (local_350.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
            (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
             )0x0) {
          (*(*(_func_int ***)
              local_350.other_.scanner_._M_t.
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
        }
        std::__cxx11::string::~string((string *)&local_2f8);
        this_00 = (string *)&local_338;
      }
      else {
        region::as_string_abi_cxx11_(&local_2d8,(region *)&local_2b8);
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (&local_228.title_,(detail *)&local_2d8,s);
        ok<std::__cxx11::string>
                  ((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_188,(toml *)&local_228,v_00);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(success_type *)local_188);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string((string *)&local_228);
        this_00 = &local_2d8;
      }
      std::__cxx11::string::~string((string *)this_00);
      region::~region((region *)&local_2b8);
      return __return_storage_ptr__;
    }
    parse_literal_string_only<toml::type_config>(&local_2b8,loc,ctx);
    if (local_2b8.is_ok_ == true) {
      this = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_2b8,(source_location)0x46a028);
      peVar3 = (error_info *)local_168;
      v = extraout_RDX_00;
      goto LAB_002f0654;
    }
    peVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap_err(&local_2b8,(source_location)0x46a040);
    peVar3 = &local_d0;
  }
  err<toml::error_info>((failure<toml::error_info> *)peVar3,peVar2);
  peVar2 = peVar3;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  ::result(__return_storage_ptr__,(failure_type *)peVar3);
  error_info::~error_info(peVar3);
LAB_002f0787:
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  ::cleanup(&local_2b8,(EVP_PKEY_CTX *)peVar2);
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::key_type, error_info>
parse_simple_key(location& loc, const context<TC>& ctx)
{
    using key_type = typename basic_value<TC>::key_type;
    const auto& spec = ctx.toml_spec();

    if(loc.current() == '\"')
    {
        auto str_res = parse_basic_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }
    else if(loc.current() == '\'')
    {
        auto str_res = parse_literal_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }

    // bare key.

    if(const auto bare = syntax::unquoted_key(spec).scan(loc))
    {
        return ok(string_conv<key_type>(bare.as_string()));
    }
    else
    {
        std::string postfix;
        if(spec.v1_1_0_allow_non_english_in_bare_keys)
        {
            postfix = "Hint: Not all Unicode characters are allowed as bare key.\n";
        }
        else
        {
            postfix = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
        }
        return err(make_syntax_error("toml::parse_simple_key: "
            "invalid key: key must be \"quoted\", 'quoted-literal', or bare key.",
            syntax::unquoted_key(spec), loc, postfix));
    }
}